

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool SetCachedTextureCoordinatesFromMaterial
               (ON_Mesh *mesh,
               function<ON_TextureMapping_(const_ON_MappingChannel_*)> *get_mapping_func,
               ON_Material *material,ON_MappingRef *mapping_ref,
               ON_SimpleArray<ON_TextureMapping::TYPE> *mappings_to_cache,bool perform_cleanup)

{
  function<ON_TextureMapping_(const_ON_MappingChannel_*)> get_mapping_func_00;
  function<ON_TextureMapping_(const_ON_MappingChannel_*)> get_mapping_func_01;
  byte bVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  ON__UINT32 OVar5;
  ON_TextureCoordinates *this;
  byte bVar6;
  undefined4 uVar7;
  long lVar8;
  ON_Xform *pOVar9;
  ON_Xform *pOVar10;
  undefined7 in_register_00000089;
  byte bVar11;
  long lVar12;
  byte bVar13;
  ON_UUID uuidWcsMapping;
  ON_SimpleArray<const_ON_Mesh_*> meshes;
  unordered_map<unsigned_int,_ON_TextureMapping,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ON_TextureMapping>_>_>
  per_vertex_channels;
  ON_UUID uuidWcsBoxMapping;
  ON_Xform ocsTransform;
  ON_TextureMapping wcsMapping;
  undefined4 in_stack_fffffffffffffc28;
  undefined4 uVar14;
  ON_Mesh *pOVar15;
  ON_MappingRef *pOVar16;
  undefined8 in_stack_fffffffffffffc40;
  _Manager_type local_3b0;
  _Any_data local_3a0;
  code *local_390;
  _Any_data local_380;
  code *local_370;
  undefined1 local_360 [32];
  ON_SimpleArray<const_ON_Mesh_*> local_340;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_ON_TextureMapping>,_std::allocator<std::pair<const_unsigned_int,_ON_TextureMapping>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_328;
  ON_UUID local_2f0;
  ON_Xform local_2e0;
  ON_TextureMapping local_260;
  
  bVar13 = 0;
  local_328._M_buckets = &local_328._M_single_bucket;
  local_328._M_bucket_count = 1;
  local_328._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_328._M_element_count = 0;
  local_328._M_rehash_policy._M_max_load_factor = 1.0;
  local_328._M_rehash_policy._M_next_resize = 0;
  local_328._M_single_bucket = (__node_base_ptr)0x0;
  std::function<ON_TextureMapping_(const_ON_MappingChannel_*)>::function
            ((function<ON_TextureMapping_(const_ON_MappingChannel_*)> *)&local_380,get_mapping_func)
  ;
  ON_Mesh_Private_AddPerVertexMappingChannels
            ((function<ON_TextureMapping_(const_ON_MappingChannel_*)> *)&local_380,mapping_ref,
             mappings_to_cache,material,
             (unordered_map<unsigned_int,_ON_TextureMapping,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ON_TextureMapping>_>_>
              *)&local_328);
  if (local_370 != (code *)0x0) {
    (*local_370)(&local_380,&local_380,__destroy_functor);
  }
  local_340._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008141b0;
  local_340.m_a = (ON_Mesh **)0x0;
  local_340.m_count = 0;
  local_340.m_capacity = 0;
  local_260.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object = (_func_int **)mesh;
  ON_SimpleArray<const_ON_Mesh_*>::Append(&local_340,(ON_Mesh **)&local_260);
  std::function<ON_TextureMapping_(const_ON_MappingChannel_*)>::function
            ((function<ON_TextureMapping_(const_ON_MappingChannel_*)> *)&stack0xfffffffffffffc40,
             get_mapping_func);
  if ((material->m_textures).super_ON_ClassArray<ON_Texture>.m_count < 1) goto LAB_00501060;
  uVar7 = (undefined4)CONCAT71(in_register_00000089,perform_cleanup);
  lVar8 = 0;
  lVar12 = 0;
  bVar1 = 0;
  bVar2 = 0;
  do {
    bVar11 = bVar2;
    bVar6 = bVar1;
    bVar3 = ON_Texture::IsWcsProjected
                      ((ON_Texture *)
                       ((long)&((ON_Texture *)
                               (&((ON_Texture *)
                                 (&((ON_Texture *)
                                   (&((material->m_textures).super_ON_ClassArray<ON_Texture>.m_a)->
                                     m_texture_id + -1))->m_texture_id + -1))->m_texture_id + -1))->
                               m_texture_id + lVar8 + 0xfffffffffffffff0U));
    bVar4 = ON_Texture::IsWcsBoxProjected
                      ((ON_Texture *)
                       ((long)&((ON_Texture *)
                               (&((ON_Texture *)
                                 (&((ON_Texture *)
                                   (&((material->m_textures).super_ON_ClassArray<ON_Texture>.m_a)->
                                     m_texture_id + -1))->m_texture_id + -1))->m_texture_id + -1))->
                               m_texture_id + lVar8 + 0xfffffffffffffff0U));
    lVar12 = lVar12 + 1;
    lVar8 = lVar8 + 0x200;
    bVar1 = bVar6 | bVar3;
    bVar2 = bVar11 | bVar4;
  } while (lVar12 < (material->m_textures).super_ON_ClassArray<ON_Texture>.m_count);
  if (bVar6 == 0 && !bVar3) {
    perform_cleanup = SUB41(uVar7,0);
    uVar14 = uVar7;
    pOVar15 = mesh;
    pOVar16 = mapping_ref;
    if (bVar11 == 0 && !bVar4) goto LAB_00501060;
LAB_00500ed1:
    perform_cleanup = SUB41(uVar7,0);
    std::function<ON_TextureMapping_(const_ON_MappingChannel_*)>::function
              ((function<ON_TextureMapping_(const_ON_MappingChannel_*)> *)&local_3a0,
               (function<ON_TextureMapping_(const_ON_MappingChannel_*)> *)&stack0xfffffffffffffc40);
    get_mapping_func_01.super__Function_base._M_functor._4_4_ = uVar14;
    get_mapping_func_01.super__Function_base._M_functor._0_4_ = in_stack_fffffffffffffc28;
    get_mapping_func_01.super__Function_base._M_functor._8_8_ = pOVar15;
    get_mapping_func_01.super__Function_base._M_manager = (_Manager_type)pOVar16;
    get_mapping_func_01._M_invoker = (_Invoker_type)in_stack_fffffffffffffc40;
    GetOcsTransform(&local_2e0,get_mapping_func_01,(ON_MappingRef *)&local_3a0);
    if (local_390 != (code *)0x0) {
      (*local_390)(&local_3a0,&local_3a0,3);
    }
    OVar5 = ON_Xform::CRC32(&local_2e0,0x4dc9aa78);
    local_2f0._0_8_ = (ulong)OVar5 | 0x46fb961700000000;
    local_2f0.Data4[0] = 0x92;
    local_2f0.Data4[1] = '?';
    local_2f0.Data4[2] = '>';
    local_2f0.Data4[3] = 'e';
    local_2f0.Data4[4] = 0xe1;
    local_2f0.Data4[5] = 'A';
    local_2f0.Data4[6] = 0x82;
    local_2f0.Data4[7] = 0xfc;
    ON_TextureMapping::ON_TextureMapping(&local_260);
    local_260.m_type = wcsbox_projection;
    ON_ModelComponent::SetId(&local_260.super_ON_ModelComponent,&local_2f0);
    pOVar9 = &local_2e0;
    pOVar10 = &local_260.m_Pxyz;
    for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
      pOVar10->m_xform[0][0] = pOVar9->m_xform[0][0];
      pOVar9 = (ON_Xform *)((long)pOVar9 + ((ulong)bVar13 * -2 + 1) * 8);
      pOVar10 = (ON_Xform *)((long)pOVar10 + ((ulong)bVar13 * -2 + 1) * 8);
    }
    ON_Xform::GetSurfaceNormalXform(&local_260.m_Pxyz,&local_260.m_Nxyz);
    bVar3 = ON_TextureMapping::HasMatchingCachedTextureCoordinates(&local_260,mesh,(ON_Xform *)0x0);
    if (!bVar3) {
      this = ON_ClassArray<ON_TextureCoordinates>::AppendNew(&mesh->m_TC);
      ON_TextureMapping::GetTextureCoordinates
                (&local_260,mesh,&this->m_T,(ON_Xform *)0x0,false,(ON_SimpleArray<int> *)0x0);
      ON_MappingTag::Set(&this->m_tag,&local_260);
      goto LAB_00501032;
    }
  }
  else {
    std::function<ON_TextureMapping_(const_ON_MappingChannel_*)>::function
              ((function<ON_TextureMapping_(const_ON_MappingChannel_*)> *)local_360,
               (function<ON_TextureMapping_(const_ON_MappingChannel_*)> *)&stack0xfffffffffffffc40);
    perform_cleanup = SUB41(uVar7,0);
    get_mapping_func_00.super__Function_base._M_functor._4_4_ = uVar7;
    get_mapping_func_00.super__Function_base._M_functor._0_4_ = in_stack_fffffffffffffc28;
    get_mapping_func_00.super__Function_base._M_functor._8_8_ = mesh;
    get_mapping_func_00.super__Function_base._M_manager = (_Manager_type)mapping_ref;
    get_mapping_func_00._M_invoker = (_Invoker_type)in_stack_fffffffffffffc40;
    uVar14 = uVar7;
    pOVar15 = mesh;
    pOVar16 = mapping_ref;
    GetOcsTransform(&local_2e0,get_mapping_func_00,(ON_MappingRef *)local_360);
    if ((_func_int **)local_360._16_8_ != (_func_int **)0x0) {
      (*(code *)local_360._16_8_)(local_360,local_360,3);
    }
    OVar5 = ON_Xform::CRC32(&local_2e0,0x47d62129);
    local_3a0._M_unused._M_member_pointer = (ulong)OVar5 | 0x4e3d341e00000000;
    local_3a0._8_8_ = 0x98edf41a059c11bf;
    ON_TextureMapping::ON_TextureMapping(&local_260);
    local_260.m_type = wcs_projection;
    ON_ModelComponent::SetId(&local_260.super_ON_ModelComponent,(ON_UUID *)&local_3a0);
    pOVar9 = &local_2e0;
    pOVar10 = &local_260.m_Pxyz;
    for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
      pOVar10->m_xform[0][0] = pOVar9->m_xform[0][0];
      pOVar9 = (ON_Xform *)((long)pOVar9 + ((ulong)bVar13 * -2 + 1) * 8);
      pOVar10 = (ON_Xform *)((long)pOVar10 + ((ulong)bVar13 * -2 + 1) * 8);
    }
    bVar3 = ON_TextureMapping::HasMatchingCachedTextureCoordinates(&local_260,mesh,(ON_Xform *)0x0);
    if (bVar3) {
      ON_TextureMapping::~ON_TextureMapping(&local_260);
      if (bVar11 == 0 && !bVar4) goto LAB_00501060;
      goto LAB_00500ed1;
    }
    this = ON_ClassArray<ON_TextureCoordinates>::AppendNew(&mesh->m_TC);
    ON_TextureMapping::GetTextureCoordinates
              (&local_260,mesh,&this->m_T,(ON_Xform *)0x0,false,(ON_SimpleArray<int> *)0x0);
    ON_MappingTag::Set(&this->m_tag,&local_260);
LAB_00501032:
    perform_cleanup = SUB41(uVar7,0);
    pOVar9 = &ON_Xform::ZeroTransformation;
    pOVar10 = &(this->m_tag).m_mesh_xform;
    for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
      pOVar10->m_xform[0][0] = pOVar9->m_xform[0][0];
      pOVar9 = (ON_Xform *)((long)pOVar9 + ((ulong)bVar13 * -2 + 1) * 8);
      pOVar10 = (ON_Xform *)((long)pOVar10 + (ulong)bVar13 * -0x10 + 8);
    }
    this->m_dim = 2;
  }
  ON_TextureMapping::~ON_TextureMapping(&local_260);
LAB_00501060:
  if (local_3b0 != (_Manager_type)0x0) {
    (*local_3b0)((_Any_data *)&stack0xfffffffffffffc40,(_Any_data *)&stack0xfffffffffffffc40,
                 __destroy_functor);
  }
  ON_Mesh_Private_SetCachedTextureCoordinatesFromMaterial
            (&local_340,
             (unordered_map<unsigned_int,_ON_TextureMapping,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ON_TextureMapping>_>_>
              *)&local_328,mapping_ref,perform_cleanup,(shared_ptr<CRhVboData> *)0x0);
  ON_SimpleArray<const_ON_Mesh_*>::~ON_SimpleArray(&local_340);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_ON_TextureMapping>,_std::allocator<std::pair<const_unsigned_int,_ON_TextureMapping>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_328);
  return true;
}

Assistant:

bool SetCachedTextureCoordinatesFromMaterial(const ON_Mesh& mesh, std::function<ON_TextureMapping(const ON_MappingChannel*)> get_mapping_func, const ON_Material& material, const ON_MappingRef* mapping_ref, const ON_SimpleArray<ON_TextureMapping::TYPE>& mappings_to_cache, bool perform_cleanup)
{
  // Create a map of all texture mappings that require per-vertex texture coordinates
  std::unordered_map<unsigned int, ON_TextureMapping> per_vertex_channels;
  if (!ON_Mesh_Private_AddPerVertexMappingChannels(get_mapping_func, mapping_ref, mappings_to_cache, material, per_vertex_channels))
    return false;

  ON_SimpleArray<const ON_Mesh*> meshes;
  meshes.Append(&mesh);

  CacheWcsProjections(mesh, get_mapping_func, material, mapping_ref);

  return ON_Mesh_Private_SetCachedTextureCoordinatesFromMaterial(meshes, per_vertex_channels, mapping_ref, perform_cleanup, nullptr);
}